

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::AggregateMessageSet::ByteSizeLong(AggregateMessageSet *this)

{
  bool bVar1;
  int desired;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  size_t local_20;
  size_t total_size;
  AggregateMessageSet *this_;
  AggregateMessageSet *this_local;
  
  local_20 = google::protobuf::internal::ExtensionSet::MessageSetByteSize
                       (&(this->field_0)._impl_._extensions_);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    sVar2 = google::protobuf::internal::ComputeUnknownMessageSetItemsSize(unknown_fields);
    local_20 = sVar2 + local_20;
  }
  desired = google::protobuf::internal::ToCachedSize(local_20);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,desired);
  return local_20;
}

Assistant:

::size_t AggregateMessageSet::ByteSizeLong() const {
  const AggregateMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_set_byte_size_start:proto2_unittest.AggregateMessageSet)
  ::size_t total_size = this_._impl_._extensions_.MessageSetByteSize();
  if (this_._internal_metadata_.have_unknown_fields()) {
    total_size += ::_pbi::ComputeUnknownMessageSetItemsSize(
        this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance));
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}